

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

int __thiscall
fmt::internal::CharTraits<char>::format_float<long_double>
          (CharTraits<char> *this,char *buffer,size_t size,char *format,uint width,int precision,
          longdouble value)

{
  int iVar1;
  
  if ((int)format == 0) {
    if ((int)width < 0) {
      iVar1 = snprintf((char *)this,(size_t)buffer,(char *)size);
      return iVar1;
    }
    format = (char *)(ulong)width;
  }
  else if (-1 < (int)width) {
    iVar1 = snprintf((char *)this,(size_t)buffer,(char *)size);
    return iVar1;
  }
  iVar1 = snprintf((char *)this,(size_t)buffer,(char *)size,format,width,precision,value);
  return iVar1;
}

Assistant:

int fmt::internal::CharTraits<char>::format_float(
    char *buffer, std::size_t size, const char *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SNPRINTF(buffer, size, format, value) :
        FMT_SNPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SNPRINTF(buffer, size, format, width, value) :
      FMT_SNPRINTF(buffer, size, format, width, precision, value);
}